

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O3

Vec_Wec_t * Gia_ManCheckUnateVec(Gia_Man_t *p,Vec_Int_t *vCiIds,Vec_Int_t *vCoIds)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  void *pvVar8;
  Vec_Wec_t *pVVar9;
  Vec_Int_t *pVVar10;
  int *__ptr;
  int *__ptr_00;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  int *piVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int *piVar23;
  int *piVar24;
  long lVar25;
  size_t sVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint *local_68;
  void *local_60;
  uint *local_58;
  
  if (vCiIds == (Vec_Int_t *)0x0) {
    uVar18 = p->vCis->nSize;
    local_68 = (uint *)malloc(0x10);
    uVar20 = 0x10;
    if (0xe < uVar18 - 1) {
      uVar20 = uVar18;
    }
    *local_68 = uVar20;
    if (uVar20 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar20 << 2);
    }
    *(void **)(local_68 + 2) = pvVar8;
    local_68[1] = uVar18;
    auVar7 = _DAT_0093d220;
    if ((int)uVar18 < 1) {
      bVar6 = false;
    }
    else {
      lVar16 = (ulong)uVar18 - 1;
      auVar28._8_4_ = (int)lVar16;
      auVar28._0_8_ = lVar16;
      auVar28._12_4_ = (int)((ulong)lVar16 >> 0x20);
      uVar12 = 0;
      auVar28 = auVar28 ^ _DAT_0093d220;
      auVar31 = _DAT_0093d210;
      do {
        auVar30 = auVar31 ^ auVar7;
        if ((bool)(~(auVar30._4_4_ == auVar28._4_4_ && auVar28._0_4_ < auVar30._0_4_ ||
                    auVar28._4_4_ < auVar30._4_4_) & 1)) {
          *(int *)((long)pvVar8 + uVar12 * 4) = (int)uVar12;
        }
        if ((auVar30._12_4_ != auVar28._12_4_ || auVar30._8_4_ <= auVar28._8_4_) &&
            auVar30._12_4_ <= auVar28._12_4_) {
          *(int *)((long)pvVar8 + uVar12 * 4 + 4) = (int)uVar12 + 1;
        }
        uVar12 = uVar12 + 2;
        lVar16 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + 2;
        auVar31._8_8_ = lVar16 + 2;
      } while ((uVar18 + 1 & 0xfffffffe) != uVar12);
      bVar6 = true;
    }
  }
  else {
    local_68 = (uint *)malloc(0x10);
    uVar18 = vCiIds->nSize;
    local_68[1] = uVar18;
    *local_68 = uVar18;
    if ((long)(int)uVar18 == 0) {
      sVar26 = 0;
      pvVar8 = (void *)0x0;
    }
    else {
      sVar26 = (long)(int)uVar18 * 4;
      pvVar8 = malloc(sVar26);
    }
    *(void **)(local_68 + 2) = pvVar8;
    memcpy(pvVar8,vCiIds->pArray,sVar26);
    bVar6 = 0 < (int)uVar18;
  }
  if (vCoIds == (Vec_Int_t *)0x0) {
    uVar18 = p->vCos->nSize;
    local_58 = (uint *)malloc(0x10);
    uVar17 = uVar18 - 1;
    uVar20 = 0x10;
    if (0xe < uVar17) {
      uVar20 = uVar18;
    }
    *local_58 = uVar20;
    if (uVar20 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar20 << 2);
    }
    *(void **)(local_58 + 2) = pvVar8;
    local_58[1] = uVar18;
    auVar7 = _DAT_0093d220;
    if (0 < (int)uVar18) {
      lVar16 = (ulong)uVar18 - 1;
      auVar29._8_4_ = (int)lVar16;
      auVar29._0_8_ = lVar16;
      auVar29._12_4_ = (int)((ulong)lVar16 >> 0x20);
      uVar12 = 0;
      auVar29 = auVar29 ^ _DAT_0093d220;
      auVar30 = _DAT_0093d210;
      do {
        auVar31 = auVar30 ^ auVar7;
        if ((bool)(~(auVar31._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar31._0_4_ ||
                    auVar29._4_4_ < auVar31._4_4_) & 1)) {
          *(int *)((long)pvVar8 + uVar12 * 4) = (int)uVar12;
        }
        if ((auVar31._12_4_ != auVar29._12_4_ || auVar31._8_4_ <= auVar29._8_4_) &&
            auVar31._12_4_ <= auVar29._12_4_) {
          *(int *)((long)pvVar8 + uVar12 * 4 + 4) = (int)uVar12 + 1;
        }
        uVar12 = uVar12 + 2;
        lVar16 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + 2;
        auVar30._8_8_ = lVar16 + 2;
      } while ((uVar18 + 1 & 0xfffffffe) != uVar12);
    }
  }
  else {
    local_58 = (uint *)malloc(0x10);
    uVar18 = vCoIds->nSize;
    local_58[1] = uVar18;
    *local_58 = uVar18;
    if ((long)(int)uVar18 == 0) {
      sVar26 = 0;
      pvVar8 = (void *)0x0;
    }
    else {
      sVar26 = (long)(int)uVar18 << 2;
      pvVar8 = malloc(sVar26);
    }
    *(void **)(local_58 + 2) = pvVar8;
    memcpy(pvVar8,vCoIds->pArray,sVar26);
    uVar17 = uVar18 - 1;
  }
  pVVar9 = (Vec_Wec_t *)malloc(0x10);
  uVar20 = uVar18;
  if (uVar17 < 7) {
    uVar20 = 8;
  }
  pVVar9->nCap = uVar20;
  if (uVar20 == 0) {
    pVVar10 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar10 = (Vec_Int_t *)calloc((long)(int)uVar20,0x10);
  }
  pVVar9->pArray = pVVar10;
  pVVar9->nSize = uVar18;
  iVar21 = p->nObjs;
  __ptr = (int *)malloc(0x10);
  iVar14 = 8;
  if (6 < iVar21 - 1U) {
    iVar14 = iVar21;
  }
  *__ptr = iVar14;
  if (iVar14 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = calloc((long)iVar14,0x10);
  }
  *(void **)(__ptr + 2) = pvVar8;
  __ptr[1] = iVar21;
  if (bVar6) {
    lVar16 = 0;
    do {
      iVar14 = *(int *)(*(long *)(local_68 + 2) + lVar16 * 4);
      if (((long)iVar14 < 0) || (p->vCis->nSize <= iVar14)) goto LAB_007d7be8;
      iVar22 = p->vCis->pArray[iVar14];
      if (((long)iVar22 < 0) || (p->nObjs <= iVar22)) goto LAB_007d7bc9;
      if (iVar21 <= iVar22) goto LAB_007d7baa;
      Vec_IntPush((Vec_Int_t *)((long)iVar22 * 0x10 + (long)pvVar8),iVar14 * 2);
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)local_68[1]);
    iVar21 = p->nObjs;
  }
  if (0 < iVar21) {
    lVar16 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + lVar16;
      uVar12 = *(ulong *)pGVar5;
      uVar18 = (uint)uVar12;
      if ((~uVar18 & 0x1fffffff) != 0 && -1 < (int)uVar18) {
        uVar20 = (int)lVar16 - (uVar18 & 0x1fffffff);
        if ((int)uVar20 < 0) goto LAB_007d7baa;
        uVar17 = __ptr[1];
        if ((((int)uVar17 <= (int)uVar20) ||
            (uVar13 = (int)lVar16 - ((uint)(uVar12 >> 0x20) & 0x1fffffff), (int)uVar13 < 0)) ||
           (uVar17 <= uVar13)) goto LAB_007d7baa;
        lVar11 = *(long *)(__ptr + 2);
        lVar25 = (ulong)uVar20 * 0x10 + lVar11;
        if (((uVar18 >> 0x1d & 1) != 0) && (iVar21 = *(int *)(lVar25 + 4), 0 < iVar21)) {
          lVar27 = *(long *)(lVar25 + 8);
          iVar14 = 0;
          do {
            iVar22 = iVar14 + 1;
            uVar18 = *(uint *)(lVar27 + (long)iVar14 * 4);
            if (iVar22 < iVar21) {
              if (((int)uVar18 < 0) ||
                 (uVar20 = *(uint *)(lVar27 + (long)iVar22 * 4), (int)uVar20 < 0))
              goto LAB_007d7b8b;
              if (1 < (uVar20 ^ uVar18)) goto LAB_007d7697;
              iVar14 = iVar14 + 2;
            }
            else {
LAB_007d7697:
              *(uint *)(lVar27 + (long)iVar14 * 4) = uVar18 ^ 1;
              iVar21 = *(int *)(lVar25 + 4);
              iVar14 = iVar22;
            }
          } while (iVar14 < iVar21);
          uVar12 = *(ulong *)pGVar5;
        }
        lVar27 = (ulong)uVar13 * 0x10 + lVar11;
        if (((uVar12 & 0x2000000000000000) != 0) && (iVar21 = *(int *)(lVar27 + 4), 0 < iVar21)) {
          lVar15 = *(long *)(lVar27 + 8);
          iVar14 = 0;
          do {
            iVar22 = iVar14 + 1;
            uVar18 = *(uint *)(lVar15 + (long)iVar14 * 4);
            if (iVar22 < iVar21) {
              if (((int)uVar18 < 0) ||
                 (uVar20 = *(uint *)(lVar15 + (long)iVar22 * 4), (int)uVar20 < 0))
              goto LAB_007d7b8b;
              if (1 < (uVar20 ^ uVar18)) goto LAB_007d770c;
              iVar22 = iVar14 + 2;
            }
            else {
LAB_007d770c:
              *(uint *)(lVar15 + (long)iVar14 * 4) = uVar18 ^ 1;
              iVar21 = *(int *)(lVar27 + 4);
            }
            iVar14 = iVar22;
          } while (iVar22 < iVar21);
        }
        if ((int)uVar17 <= lVar16) goto LAB_007d7baa;
        lVar15 = lVar16 * 0x10;
        piVar1 = (int *)(lVar11 + lVar15);
        iVar14 = *(int *)(lVar25 + 4);
        iVar22 = *(int *)(lVar27 + 4);
        iVar21 = iVar22 + iVar14;
        __ptr_00 = *(int **)(lVar11 + 8 + lVar15);
        if (*(int *)(lVar11 + lVar15) < iVar21) {
          if (__ptr_00 == (int *)0x0) {
            __ptr_00 = (int *)malloc((long)iVar21 << 2);
          }
          else {
            __ptr_00 = (int *)realloc(__ptr_00,(long)iVar21 << 2);
          }
          *(int **)(piVar1 + 2) = __ptr_00;
          if (__ptr_00 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *piVar1 = iVar21;
          iVar14 = *(int *)(lVar25 + 4);
          iVar22 = *(int *)(lVar27 + 4);
        }
        piVar3 = *(int **)(lVar25 + 8);
        piVar4 = *(int **)(lVar27 + 8);
        piVar19 = __ptr_00;
        piVar24 = piVar3;
        piVar23 = piVar4;
        if ((0 < iVar14) && (0 < iVar22)) {
          do {
            iVar21 = *piVar24;
            iVar2 = *piVar23;
            if (iVar21 == iVar2) {
              piVar24 = piVar24 + 1;
              *piVar19 = iVar21;
              piVar23 = piVar23 + 1;
            }
            else if (iVar21 < iVar2) {
              piVar24 = piVar24 + 1;
              *piVar19 = iVar21;
            }
            else {
              piVar23 = piVar23 + 1;
              *piVar19 = iVar2;
            }
            piVar19 = piVar19 + 1;
          } while ((piVar24 < piVar3 + iVar14) && (piVar23 < piVar4 + iVar22));
        }
        for (; piVar24 < piVar3 + iVar14; piVar24 = piVar24 + 1) {
          *piVar19 = *piVar24;
          piVar19 = piVar19 + 1;
        }
        for (; piVar23 < piVar4 + iVar22; piVar23 = piVar23 + 1) {
          *piVar19 = *piVar23;
          piVar19 = piVar19 + 1;
        }
        iVar21 = (int)((ulong)((long)piVar19 - (long)__ptr_00) >> 2);
        piVar1[1] = iVar21;
        if (*piVar1 < iVar21) {
          __assert_fail("vArr->nSize <= vArr->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x72c,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        iVar14 = *(int *)(lVar25 + 4);
        if (iVar21 < iVar14) {
          __assert_fail("vArr->nSize >= vArr1->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x72d,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar21 < *(int *)(lVar27 + 4)) {
          __assert_fail("vArr->nSize >= vArr2->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x72e,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        uVar12 = *(ulong *)pGVar5;
        if ((0 < iVar14) && ((uVar12 & 0x20000000) != 0)) {
          iVar21 = 0;
          do {
            iVar22 = iVar21 + 1;
            uVar18 = piVar3[iVar21];
            if (iVar22 < iVar14) {
              if (((int)uVar18 < 0) || (piVar3[iVar22] < 0)) goto LAB_007d7b8b;
              if (1 < (piVar3[iVar22] ^ uVar18)) goto LAB_007d78a7;
              iVar21 = iVar21 + 2;
            }
            else {
LAB_007d78a7:
              piVar3[iVar21] = uVar18 ^ 1;
              iVar14 = *(int *)(lVar25 + 4);
              iVar21 = iVar22;
            }
          } while (iVar21 < iVar14);
          uVar12 = *(ulong *)pGVar5;
        }
        if (((uVar12 & 0x2000000000000000) != 0) && (iVar21 = *(int *)(lVar27 + 4), 0 < iVar21)) {
          iVar14 = 0;
          do {
            iVar22 = iVar14 + 1;
            uVar18 = piVar4[iVar14];
            if (iVar22 < iVar21) {
              if (((int)uVar18 < 0) || (piVar4[iVar22] < 0)) goto LAB_007d7b8b;
              if (1 < (piVar4[iVar22] ^ uVar18)) goto LAB_007d790d;
              iVar22 = iVar14 + 2;
            }
            else {
LAB_007d790d:
              piVar4[iVar14] = uVar18 ^ 1;
              iVar21 = *(int *)(lVar27 + 4);
            }
            iVar14 = iVar22;
          } while (iVar22 < iVar21);
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < p->nObjs);
  }
  if ((int)local_58[1] < 1) {
    local_60 = *(void **)(__ptr + 2);
  }
  else {
    lVar16 = 0;
    do {
      iVar21 = *(int *)(*(long *)(local_58 + 2) + lVar16 * 4);
      if (((long)iVar21 < 0) || (p->vCos->nSize <= iVar21)) {
LAB_007d7be8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar21 = p->vCos->pArray[iVar21];
      lVar11 = (long)iVar21;
      if ((lVar11 < 0) || (p->nObjs <= iVar21)) {
LAB_007d7bc9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar5 = p->pObjs;
      uVar18 = *(uint *)(pGVar5 + lVar11);
      uVar20 = iVar21 - (uVar18 & 0x1fffffff);
      if (((int)uVar20 < 0) || (__ptr[1] <= (int)uVar20)) {
LAB_007d7baa:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      local_60 = *(void **)(__ptr + 2);
      if (((uVar18 >> 0x1d & 1) != 0) &&
         (iVar21 = *(int *)((long)local_60 + (ulong)uVar20 * 0x10 + 4), 0 < iVar21)) {
        lVar25 = *(long *)((long)local_60 + (ulong)uVar20 * 0x10 + 8);
        iVar14 = 0;
        do {
          iVar22 = iVar14 + 1;
          uVar18 = *(uint *)(lVar25 + (long)iVar14 * 4);
          if (iVar22 < iVar21) {
            if (((int)uVar18 < 0) ||
               (uVar17 = *(uint *)(lVar25 + (long)iVar22 * 4), (int)uVar17 < 0)) goto LAB_007d7b8b;
            if (1 < (uVar17 ^ uVar18)) goto LAB_007d7a03;
            iVar22 = iVar14 + 2;
          }
          else {
LAB_007d7a03:
            *(uint *)(lVar25 + (long)iVar14 * 4) = uVar18 ^ 1;
            iVar21 = *(int *)((long)local_60 + (ulong)uVar20 * 0x10 + 4);
          }
          iVar14 = iVar22;
        } while (iVar22 < iVar21);
      }
      if (pVVar9->nSize <= lVar16) goto LAB_007d7baa;
      uVar18 = *(uint *)((long)local_60 + (ulong)uVar20 * 0x10 + 4);
      uVar12 = (ulong)uVar18;
      if (0 < (int)uVar18) {
        pVVar10 = pVVar9->pArray;
        lVar25 = 0;
        do {
          Vec_IntPush(pVVar10 + lVar16,
                      *(int *)(*(long *)((long)local_60 + (ulong)uVar20 * 0x10 + 8) + lVar25 * 4));
          lVar25 = lVar25 + 1;
          uVar12 = (ulong)*(int *)((long)local_60 + (ulong)uVar20 * 0x10 + 4);
        } while (lVar25 < (long)uVar12);
      }
      if (((pGVar5[lVar11].field_0x3 & 0x20) != 0) && (0 < (int)uVar12)) {
        lVar11 = *(long *)((long)local_60 + (ulong)uVar20 * 0x10 + 8);
        iVar21 = 0;
        do {
          iVar14 = iVar21 + 1;
          uVar18 = *(uint *)(lVar11 + (long)iVar21 * 4);
          if (iVar14 < (int)uVar12) {
            if (((int)uVar18 < 0) ||
               (uVar17 = *(uint *)(lVar11 + (long)iVar14 * 4), (int)uVar17 < 0)) {
LAB_007d7b8b:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (1 < (uVar17 ^ uVar18)) goto LAB_007d7abd;
            iVar14 = iVar21 + 2;
          }
          else {
LAB_007d7abd:
            *(uint *)(lVar11 + (long)iVar21 * 4) = uVar18 ^ 1;
            uVar12 = (ulong)*(uint *)((long)local_60 + (ulong)uVar20 * 0x10 + 4);
          }
          iVar21 = iVar14;
        } while (iVar14 < (int)uVar12);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)local_58[1]);
  }
  iVar21 = *__ptr;
  if ((long)iVar21 < 1) {
    if (local_60 == (void *)0x0) goto LAB_007d7b43;
  }
  else {
    lVar16 = 0;
    do {
      pvVar8 = *(void **)((long)local_60 + lVar16 + 8);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        *(undefined8 *)((long)local_60 + lVar16 + 8) = 0;
      }
      lVar16 = lVar16 + 0x10;
    } while ((long)iVar21 * 0x10 != lVar16);
  }
  free(local_60);
LAB_007d7b43:
  free(__ptr);
  if (*(void **)(local_68 + 2) != (void *)0x0) {
    free(*(void **)(local_68 + 2));
  }
  free(local_68);
  if (*(void **)(local_58 + 2) != (void *)0x0) {
    free(*(void **)(local_58 + 2));
  }
  free(local_58);
  return pVVar9;
}

Assistant:

Vec_Wec_t * Gia_ManCheckUnateVec( Gia_Man_t * p, Vec_Int_t * vCiIds, Vec_Int_t * vCoIds )
{
    Vec_Int_t * vCiVec = vCiIds ? Vec_IntDup(vCiIds) : Vec_IntStartNatural(Gia_ManCiNum(p));
    Vec_Int_t * vCoVec = vCoIds ? Vec_IntDup(vCoIds) : Vec_IntStartNatural(Gia_ManCoNum(p));
    Vec_Wec_t * vUnatesCo = Vec_WecStart( Vec_IntSize(vCoVec) );
    Vec_Wec_t * vUnates   = Vec_WecStart( Gia_ManObjNum(p) );
    Vec_Int_t * vUnate0, * vUnate1;
    Gia_Obj_t * pObj; int i, CioId;
    Vec_IntForEachEntry( vCiVec, CioId, i )
    {
        pObj = Gia_ManCi( p, CioId );
        Vec_IntPush( Vec_WecEntry(vUnates, Gia_ObjId(p, pObj)), Abc_Var2Lit(CioId, 0) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        vUnate0 = Vec_WecEntry(vUnates, Gia_ObjFaninId0(pObj, i));
        vUnate1 = Vec_WecEntry(vUnates, Gia_ObjFaninId1(pObj, i));
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        vUnate1 = Gia_ObjFaninC1(pObj) ? Vec_IntFlopBit(vUnate1) : vUnate1;
        Vec_IntTwoMerge2( vUnate0, vUnate1, Vec_WecEntry(vUnates, i) ); 
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        vUnate1 = Gia_ObjFaninC1(pObj) ? Vec_IntFlopBit(vUnate1) : vUnate1;
    }
    Vec_IntForEachEntry( vCoVec, CioId, i )
    {
        pObj    = Gia_ManCo( p, CioId );
        vUnate0 = Vec_WecEntry(vUnates, Gia_ObjFaninId0p(p, pObj));
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        Vec_IntAppend( Vec_WecEntry(vUnatesCo, i), vUnate0 );
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
    }
    Vec_WecFree( vUnates );
    Vec_IntFree( vCiVec );
    Vec_IntFree( vCoVec );
    return vUnatesCo;
}